

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *p,int nPref)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  if (p->vNonXRegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNonXRegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                  ,0xe6,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
  }
  uVar1 = p->pAig->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  p->vNonXRegs = pVVar4;
  if ((int)uVar1 < 1) {
    iVar3 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar3 = p->vStates->nSize;
      uVar6 = (ulong)(uint)nPref;
      if (nPref < iVar3) {
        uVar7 = uVar9 * 2 & 0x1e;
        do {
          if (nPref < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar2 = *(uint *)((long)p->vStates->pArray[uVar6] + (ulong)(uVar9 >> 4) * 4);
          iVar8 = (uint)((uVar2 >> uVar7 & 1) != 0) + (uVar2 >> ((char)uVar7 + 1U & 0x1f) & 1) * 2;
          if (iVar8 == 3) goto LAB_00635fc2;
          if (iVar8 == 0) {
            __assert_fail("Value != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                          ,0xed,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
          }
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < iVar3);
LAB_00635fca:
        pVVar4 = p->vNonXRegs;
        uVar7 = pVVar4->nSize;
        if (uVar7 == pVVar4->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) {
LAB_006360bd:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar4->nCap = 0x10;
          }
          else {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar7 * 8);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar7 * 8);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_006360bd;
            pVVar4->nCap = uVar7 * 2;
          }
        }
        else {
          piVar5 = pVVar4->pArray;
        }
        iVar3 = pVVar4->nSize;
        pVVar4->nSize = iVar3 + 1;
        piVar5[iVar3] = uVar9;
      }
      else {
LAB_00635fc2:
        if ((int)uVar6 == iVar3) goto LAB_00635fca;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
    iVar3 = p->vNonXRegs->nSize;
  }
  return iVar3;
}

Assistant:

int Saig_TsiCountNonXValuedRegisters( Saig_Tsim_t * p, int nPref )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k;
    assert( p->vNonXRegs == NULL );
    p->vNonXRegs = Vec_IntAlloc( 10 );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntryStart( unsigned *, p->vStates, pState, k, nPref )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            assert( Value != 0 );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Vec_IntPush( p->vNonXRegs, i );
    }
    return Vec_IntSize(p->vNonXRegs);
}